

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.h
# Opt level: O1

void __thiscall snestistics::Range::format(Range *this,StringBuilder *s)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  
  iVar2 = this->N;
  if (iVar2 == 0) {
    return;
  }
  if (3 < iVar2) {
    uVar1 = this->first;
    StringBuilder::format
              (s,"<%X, %X, ..., %X>",(ulong)uVar1,(ulong)(this->step + uVar1),
               (ulong)(iVar2 * this->step + uVar1));
    return;
  }
  if (this->N < 2) {
    iVar2 = this->N + -1;
  }
  else {
    iVar3 = 0;
    do {
      StringBuilder::format(s,"%X, ",(ulong)(uint)(this->step * iVar3 + this->first));
      iVar3 = iVar3 + 1;
      iVar2 = this->N + -1;
    } while (iVar3 < iVar2);
  }
  StringBuilder::format(s,"%X",(ulong)(uint)(iVar2 * this->step + this->first));
  return;
}

Assistant:

void format(StringBuilder &s) {
		if (N==0) {
		} else if (N<4) {
			for (int k=0; k<N-1; k++) {
				s.format("%X, ", first+step*k);
			}
			s.format("%X", first+step*(N-1));
		} else {
			int last = first + step * N;
			s.format("<%X, %X, ..., %X>", first, first + step, last);
		}
	}